

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O1

Dch_Cla_t * Dch_CreateCandEquivClasses(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  void **ppvVar1;
  void **ppvVar2;
  Vec_Ptr_t *vSims;
  Dch_Cla_t *p;
  void **ppvVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = pAig->vObjs->nSize;
  lVar5 = (long)iVar4;
  ppvVar1 = (void **)malloc(((long)nWords * 4 + 8) * lVar5);
  if (0 < lVar5) {
    ppvVar2 = ppvVar1 + lVar5;
    ppvVar3 = ppvVar1;
    do {
      *ppvVar3 = ppvVar2;
      ppvVar3 = ppvVar3 + 1;
      ppvVar2 = (void **)((long)ppvVar2 + (long)nWords * 4);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  vSims = (Vec_Ptr_t *)malloc(0x10);
  vSims->nSize = iVar4;
  vSims->nCap = iVar4;
  vSims->pArray = ppvVar1;
  Dch_PerformRandomSimulation(pAig,vSims);
  p = Dch_ClassesStart(pAig);
  Dch_ClassesSetData(p,vSims,Dch_NodeHash,Dch_NodeIsConst,Dch_NodesAreEqual);
  Dch_ClassesPrepare(p,0,0);
  iVar4 = 7;
  do {
    Dch_PerformRandomSimulation(pAig,vSims);
    Dch_ClassesRefine(p);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (vSims->pArray != (void **)0x0) {
    free(vSims->pArray);
    vSims->pArray = (void **)0x0;
  }
  free(vSims);
  Dch_ClassesSetData(p,(void *)0x0,(_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0,Dch_NodeIsConstCex,
                     Dch_NodesAreEqualCex);
  return p;
}

Assistant:

Dch_Cla_t * Dch_CreateCandEquivClasses( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Dch_Cla_t * pClasses;
    Vec_Ptr_t * vSims;
    int i;
    // allocate simulation information
    vSims = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    // run random simulation from the primary inputs
    Dch_PerformRandomSimulation( pAig, vSims );
    // start storage for equivalence classes
    pClasses = Dch_ClassesStart( pAig );
    Dch_ClassesSetData( pClasses, vSims, Dch_NodeHash, Dch_NodeIsConst, Dch_NodesAreEqual );
    // hash nodes by sim info
    Dch_ClassesPrepare( pClasses, 0, 0 );
    // iterate random simulation
    for ( i = 0; i < 7; i++ )
    {
        Dch_PerformRandomSimulation( pAig, vSims );
        Dch_ClassesRefine( pClasses );
    }
    // clean up and return
    Vec_PtrFree( vSims );
    // prepare class refinement procedures
    Dch_ClassesSetData( pClasses, NULL, NULL, Dch_NodeIsConstCex, Dch_NodesAreEqualCex );
    return pClasses;
}